

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int level;
  Argument *pAVar2;
  enable_if_t<std::is_arithmetic_v<int>,_Argument_&> pAVar3;
  ostream *poVar4;
  string_view arg_name;
  string_view arg_name_00;
  logger log;
  allocator<char> local_3fe;
  allocator<char> local_3fd;
  int local_3fc [7];
  any local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  lmss l;
  ArgumentParser app;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"lmss",(allocator<char> *)&l);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"4.2.3",(allocator<char> *)&log);
  argparse::ArgumentParser::ArgumentParser
            (&app,&local_390,&local_3b0,help,true,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&app,"-v");
  l.super_context._vptr_context._0_4_ = 3;
  pAVar2 = argparse::Argument::default_value<int>(pAVar2,(int *)&l);
  log.ll = 0;
  local_3fc[0] = 1;
  local_3fc[6] = 2;
  local_3fc[5] = 3;
  local_3fc[4] = 4;
  local_3fc[3] = 5;
  local_3fc[2] = 6;
  local_3fc[1] = 7;
  pAVar2 = argparse::Argument::choices<int,int,int,int,int,int,int,int>
                     (pAVar2,&log.ll,local_3fc,local_3fc + 6,local_3fc + 5,local_3fc + 4,
                      local_3fc + 3,local_3fc + 2,local_3fc + 1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"LEVEL",&local_3fd);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->m_metavar,&local_3d0);
  pAVar2 = argparse::Argument::nargs(pAVar2,1);
  pAVar3 = argparse::Argument::scan<(char)105,int>(pAVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"set log verbosity (0-7)",&local_3fe);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar3->m_help,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_3d0);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>(&app,"-V","--version");
  l.super_context._vptr_context._0_4_ = (uint)l.super_context._vptr_context & 0xffffff00;
  pAVar2 = argparse::Argument::default_value<bool>(pAVar2,(bool *)&l);
  local_3e0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_3e0._M_storage = (_Storage)0x1;
  pAVar2 = argparse::Argument::implicit_value(pAVar2,&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"print lmss version",(allocator<char> *)&log);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->m_help,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::any::reset(&local_3e0);
  argparse::ArgumentParser::parse_args(&app,argc,argv);
  arg_name._M_str = "-V";
  arg_name._M_len = 2;
  bVar1 = argparse::ArgumentParser::get<bool>(&app,arg_name);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"lmss version ");
    poVar4 = std::operator<<(poVar4,"4.2.3");
    std::endl<char,std::char_traits<char>>(poVar4);
    argparse::ArgumentParser::~ArgumentParser(&app);
    return 0;
  }
  arg_name_00._M_str = "-v";
  arg_name_00._M_len = 2;
  level = argparse::ArgumentParser::get<int>(&app,arg_name_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&l,"LMSS",(allocator<char> *)local_3fc);
  logger::logger(&log,(string *)&l,level);
  std::__cxx11::string::~string((string *)&l);
  do {
    lmss::lmss(&l,&log);
    event_loop::run(&l.el);
    lmss::~lmss(&l);
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
    argparse::ArgumentParser app("lmss", VERSION, argparse::default_arguments::help);
    app.add_argument("-v")
        .default_value(3)
        .choices(0, 1, 2, 3, 4, 5, 6, 7)
        .metavar("LEVEL")
        .nargs(1)
        .scan<'i', int>()
        .help("set log verbosity (0-7)");
    app.add_argument("-V", "--version")
        .default_value(false)
        .implicit_value(true)
        .help("print lmss version");

    try {
        app.parse_args(argc, argv);
    } catch (std::exception const & e) {
        std::cerr << e.what() << std::endl;
        std::cerr << app;
        std::exit(1);
    }

    if (app.get<bool>("-V")) {
        std::cout << "lmss version " << VERSION << std::endl;
        return 0;
    }

    auto log_level = app.get<int>("-v");

    logger log("LMSS", log_level);

    while (true) {
        try {
            lmss l(log);
            l.run();
        } catch (std::runtime_error const & e) {
            log.err(e.what());
            log.warn("reinitializing");
            std::this_thread::sleep_for(std::chrono::seconds(1));
        }
    }

    return 0;
}